

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytedata_p.h
# Opt level: O3

ssize_t __thiscall QByteDataBuffer::read(QByteDataBuffer *this,int __fd,void *__buf,size_t __nbytes)

{
  void *pvVar1;
  long lVar2;
  QArrayData *pQVar3;
  iterator iVar4;
  void *pvVar5;
  undefined4 in_register_00000034;
  char *pcVar6;
  size_t __n;
  void *__dest;
  
  __dest = (void *)CONCAT44(in_register_00000034,__fd);
  pvVar1 = (void *)this->bufferCompleteSize;
  pvVar5 = __buf;
  if ((long)pvVar1 < (long)__buf) {
    __buf = pvVar1;
    pvVar5 = pvVar1;
  }
  while( true ) {
    if ((long)__buf < 1) {
      return (ssize_t)pvVar5;
    }
    iVar4 = QList<QByteArray>::begin(&this->buffers);
    lVar2 = this->firstPos;
    __n = ((iVar4.i)->d).size - lVar2;
    if ((long)__buf < (long)__n) break;
    this->bufferCompleteSize = this->bufferCompleteSize - __n;
    pcVar6 = ((iVar4.i)->d).ptr;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)&QByteArray::_empty;
    }
    memcpy(__dest,pcVar6 + lVar2,__n);
    this->firstPos = 0;
    iVar4 = QList<QByteArray>::begin(&this->buffers);
    pQVar3 = &(((iVar4.i)->d).d)->super_QArrayData;
    ((iVar4.i)->d).size = 0;
    ((iVar4.i)->d).d = (Data *)0x0;
    ((iVar4.i)->d).ptr = (char *)0x0;
    QtPrivate::QGenericArrayOps<QByteArray>::eraseFirst((QGenericArrayOps<QByteArray> *)this);
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,1,0x10);
      }
    }
    __dest = (void *)((long)__dest + __n);
    __buf = (void *)((long)__buf - __n);
  }
  this->bufferCompleteSize = this->bufferCompleteSize - (long)__buf;
  pcVar6 = ((iVar4.i)->d).ptr;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = (char *)&QByteArray::_empty;
  }
  memcpy(__dest,pcVar6 + lVar2,(size_t)__buf);
  this->firstPos = this->firstPos + (long)__buf;
  return (ssize_t)pvVar5;
}

Assistant:

inline qint64 byteAmount() const
    {
        return bufferCompleteSize;
    }